

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O2

void __thiscall Centaurus::LDFAState<wchar_t>::print(LDFAState<wchar_t> *this,wostream *os,int from)

{
  pointer pNVar1;
  wostream *pwVar2;
  wostream *this_00;
  int iVar3;
  NFATransition<wchar_t> *t;
  pointer pNVar4;
  
  pNVar1 = (this->
           super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
           ).m_transitions.
           super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pNVar4 = (this->
                super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                ).m_transitions.
                super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar4 != pNVar1; pNVar4 = pNVar4 + 1) {
    pwVar2 = std::operator<<(os,L"S");
    pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,from);
    std::operator<<(pwVar2,L" -> ");
    if (pNVar4->m_dest < 0) {
      this_00 = (wostream *)std::operator<<(os,L"A");
      iVar3 = -pNVar4->m_dest;
    }
    else {
      this_00 = (wostream *)std::operator<<(os,L"S");
      iVar3 = pNVar4->m_dest;
    }
    std::wostream::operator<<(this_00,iVar3);
    std::operator<<(os,L" [ label=\"");
    operator<<(os,&pNVar4->m_label);
    pwVar2 = std::operator<<(os,L"\" ];");
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  }
  return;
}

Assistant:

virtual void print(std::wostream& os, int from) const override
	{
		for (const auto& t : m_transitions)
		{
			os << L"S" << from << L" -> ";
            if (t.dest() < 0)
            {
                os << L"A" << -t.dest();
            }
            else
            {
                os << L"S" << t.dest();
            }
            os << L" [ label=\"";
			os << t.label();
			os << L"\" ];" << std::endl;
		}
	}